

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

SliceDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slicedynamic(NeuralNetworkLayer *this)

{
  SliceDynamicLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 1000) {
    clear_layer(this);
    this->_oneof_case_[0] = 1000;
    this_00 = (SliceDynamicLayerParams *)operator_new(0x88);
    SliceDynamicLayerParams::SliceDynamicLayerParams(this_00);
    (this->layer_).slicedynamic_ = this_00;
  }
  return (SliceDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceDynamicLayerParams* NeuralNetworkLayer::mutable_slicedynamic() {
  if (!has_slicedynamic()) {
    clear_layer();
    set_has_slicedynamic();
    layer_.slicedynamic_ = new ::CoreML::Specification::SliceDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sliceDynamic)
  return layer_.slicedynamic_;
}